

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlkf.cpp
# Opt level: O0

void __thiscall icu_63::LocaleKeyFactory::~LocaleKeyFactory(LocaleKeyFactory *this)

{
  void *in_RSI;
  LocaleKeyFactory *this_local;
  
  ~LocaleKeyFactory(this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

UObject*
LocaleKeyFactory::create(const ICUServiceKey& key, const ICUService* service, UErrorCode& status) const {
    if (handlesKey(key, status)) {
        const LocaleKey& lkey = (const LocaleKey&)key;
        int32_t kind = lkey.kind();
        Locale loc;
        lkey.currentLocale(loc);

        return handleCreate(loc, kind, service, status);
    }
    return NULL;
}